

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

shared_ptr<minja::Expression> __thiscall minja::Parser::parseDictionary(Parser *this)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  runtime_error *prVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  Parser *in_RDI;
  shared_ptr<minja::Expression> sVar7;
  anon_class_16_2_3265e732 parseKeyValuePair;
  vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>_>_>
  elements;
  shared_ptr<minja::DictExpr> *in_stack_fffffffffffffdd8;
  shared_ptr<minja::Expression> *in_stack_fffffffffffffde0;
  allocator<char> *in_stack_fffffffffffffdf0;
  vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>_>_>
  *in_stack_fffffffffffffe00;
  vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>_>_>
  *__args_1;
  undefined7 in_stack_fffffffffffffe08;
  allocator<char> *in_stack_fffffffffffffe10;
  allocator<char> *__a;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  Parser *this_00;
  allocator<char> local_191;
  string local_190 [12];
  SpaceHandling in_stack_fffffffffffffe7c;
  string *in_stack_fffffffffffffe80;
  Parser *in_stack_fffffffffffffe88;
  string local_170 [32];
  anon_class_16_2_3265e732 *in_stack_fffffffffffffeb0;
  string local_148 [32];
  string local_128 [40];
  undefined1 *local_100;
  undefined4 local_f4;
  allocator<char> local_c1;
  string local_c0 [32];
  string local_a0 [32];
  undefined1 local_80 [47];
  allocator<char> local_51;
  string local_50 [32];
  string local_30 [48];
  
  this_00 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
             (char *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
             in_stack_fffffffffffffe10);
  consumeToken(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  if ((bVar1 & 1) == 0) {
    std::
    vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>_>_>
    ::vector((vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>_>_>
              *)0x315c3a);
    __a = &local_c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
               (char *)CONCAT17(bVar1,in_stack_fffffffffffffe18),__a);
    consumeToken(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
    bVar2 = std::__cxx11::string::empty();
    bVar2 = bVar2 ^ 0xff;
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator(&local_c1);
    if ((bVar2 & 1) == 0) {
      local_100 = local_80;
      parseDictionary::anon_class_16_2_3265e732::operator()(in_stack_fffffffffffffeb0);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffde0,
                           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffdd8);
        if (!bVar3) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar5,"Expected closing brace");
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        __args_1 = (vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>_>_>
                    *)&stack0xfffffffffffffeb7;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                   (char *)CONCAT17(bVar1,in_stack_fffffffffffffe18),__a);
        consumeToken(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
        bVar4 = std::__cxx11::string::empty();
        std::__cxx11::string::~string(local_128);
        std::__cxx11::string::~string(local_148);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeb7);
        if (((bVar4 ^ 0xff) & 1) == 0) break;
        parseDictionary::anon_class_16_2_3265e732::operator()(in_stack_fffffffffffffeb0);
      }
      in_stack_fffffffffffffdf0 = &local_191;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 (char *)CONCAT17(bVar1,in_stack_fffffffffffffe18),__a);
      consumeToken(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
      bVar1 = std::__cxx11::string::empty();
      std::__cxx11::string::~string(local_170);
      std::__cxx11::string::~string(local_190);
      std::allocator<char>::~allocator(&local_191);
      if (((bVar1 ^ 0xff) & 1) == 0) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"Expected comma or closing brace in dictionary");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      get_location(this_00);
      std::
      make_shared<minja::DictExpr,minja::Location,std::vector<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>>,std::allocator<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>>>>>
                ((Location *)CONCAT17(bVar2,in_stack_fffffffffffffe08),__args_1);
      std::shared_ptr<minja::Expression>::shared_ptr<minja::DictExpr,void>
                (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      std::shared_ptr<minja::DictExpr>::~shared_ptr((shared_ptr<minja::DictExpr> *)0x315fe2);
      Location::~Location((Location *)0x315fec);
    }
    else {
      get_location(this_00);
      std::
      make_shared<minja::DictExpr,minja::Location,std::vector<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>>,std::allocator<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>>>>>
                ((Location *)CONCAT17(bVar2,in_stack_fffffffffffffe08),in_stack_fffffffffffffe00);
      std::shared_ptr<minja::Expression>::shared_ptr<minja::DictExpr,void>
                (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      std::shared_ptr<minja::DictExpr>::~shared_ptr((shared_ptr<minja::DictExpr> *)0x315d21);
      Location::~Location((Location *)0x315d2e);
    }
    local_f4 = 1;
    std::
    vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>_>_>
    ::~vector((vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>_>_>
               *)in_stack_fffffffffffffdf0);
    _Var6._M_pi = extraout_RDX_00;
  }
  else {
    std::shared_ptr<minja::Expression>::shared_ptr
              (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    _Var6._M_pi = extraout_RDX;
  }
  sVar7.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  sVar7.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this_00;
  return (shared_ptr<minja::Expression>)
         sVar7.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expression> parseDictionary() {
        if (consumeToken("{").empty()) return nullptr;

        std::vector<std::pair<std::shared_ptr<Expression>, std::shared_ptr<Expression>>> elements;
        if (!consumeToken("}").empty()) {
            return std::make_shared<DictExpr>(get_location(), std::move(elements));
        }

        auto parseKeyValuePair = [&]() {
            auto key = parseExpression();
            if (!key) throw std::runtime_error("Expected key in dictionary");
            if (consumeToken(":").empty()) throw std::runtime_error("Expected colon betweek key & value in dictionary");
            auto value = parseExpression();
            if (!value) throw std::runtime_error("Expected value in dictionary");
            elements.emplace_back(std::pair(std::move(key), std::move(value)));
        };

        parseKeyValuePair();

        while (it != end) {
            if (!consumeToken(",").empty()) {
                parseKeyValuePair();
            } else if (!consumeToken("}").empty()) {
                return std::make_shared<DictExpr>(get_location(), std::move(elements));
            } else {
                throw std::runtime_error("Expected comma or closing brace in dictionary");
            }
        }
        throw std::runtime_error("Expected closing brace");
    }